

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O1

wchar_t archive_read_disk_set_matching
                  (archive *_a,archive *_ma,
                  _func_void_archive_ptr_void_ptr_archive_entry_ptr *_excluded_func,
                  void *_client_data)

{
  int iVar1;
  wchar_t wVar2;
  
  iVar1 = __archive_check_magic(_a,0xbadb0c5,0x7fff,"archive_read_disk_set_matching");
  wVar2 = L'\xffffffe2';
  if (iVar1 != -0x1e) {
    _a[1].read_data_remaining = (size_t)_ma;
    *(_func_void_archive_ptr_void_ptr_archive_entry_ptr **)&_a[1].read_data_is_posix_read =
         _excluded_func;
    _a[1].read_data_requested = (size_t)_client_data;
    wVar2 = L'\0';
  }
  return wVar2;
}

Assistant:

int
archive_read_disk_set_matching(struct archive *_a, struct archive *_ma,
    void (*_excluded_func)(struct archive *, void *, struct archive_entry *),
    void *_client_data)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
	    ARCHIVE_STATE_ANY, "archive_read_disk_set_matching");
	a->matching = _ma;
	a->excluded_cb_func = _excluded_func;
	a->excluded_cb_data = _client_data;
	return (ARCHIVE_OK);
}